

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.c
# Opt level: O3

rt_function_error_t exec_celu_generic(rt_function_t *f)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong extraout_RDX;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int local_60;
  int local_58;
  
  plVar1 = (long *)f->local_context;
  puVar2 = (undefined8 *)*plVar1;
  lVar4 = (long)*(int *)((long)plVar1 + 0xc);
  iVar9 = 1;
  if (*(int *)((long)plVar1 + 0xc) < *(int *)(puVar2 + 6)) {
    iVar9 = 1;
    do {
      iVar9 = iVar9 * *(int *)(puVar2[7] + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (*(int *)(puVar2 + 6) != lVar4);
  }
  iVar3 = *(int *)(puVar2 + 2) / iVar9;
  uVar6 = (long)*(int *)(puVar2 + 2) % (long)iVar9 & 0xffffffff;
  if (0 < iVar3) {
    local_58 = 0;
    local_60 = 0;
    iVar5 = 0;
    do {
      iVar10 = local_60;
      iVar8 = local_58;
      iVar7 = iVar9;
      if (0 < iVar9) {
        do {
          fVar11 = (float)(*(code *)puVar2[1])(*puVar2,iVar8,uVar6);
          fVar13 = fVar11;
          if (fVar11 <= 0.0) {
            fVar13 = *(float *)(plVar1 + 1);
            fVar12 = expf(fVar11);
            fVar13 = (fVar12 + -1.0) * fVar13;
          }
          (*(code *)puVar2[4])(fVar13,puVar2[3],iVar10);
          if (0.0 <= fVar11) {
            fVar13 = *(float *)(plVar1 + 1);
            fVar11 = expf(-fVar11);
            fVar11 = (fVar11 + -1.0) * fVar13;
          }
          else {
            fVar11 = -fVar11;
          }
          (*(code *)puVar2[4])(fVar11,puVar2[3],iVar10 + iVar9);
          iVar7 = iVar7 + -1;
          uVar6 = extraout_RDX;
          iVar10 = iVar10 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar7 != 0);
      }
      iVar5 = iVar5 + 1;
      local_60 = local_60 + iVar9 * 2;
      local_58 = local_58 + iVar9;
    } while (iVar5 != iVar3);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_celu_generic(rt_function_t *f) {
  celu_local_context_t *c = (celu_local_context_t *)(f->local_context);
  celu_private_t *p = (celu_private_t *)(c->data);
  int i, j, s0 = 1, s1;

  for (i = c->axis; i < p->in_shape.size; ++i) {
    s0 *= p->in_shape.data[i];
  }
  s1 = p->input_size / s0;

  for (i = 0; i < s1; ++i) {
    for (j = 0; j < s0; ++j) {
      float x = p->get_input(p->input, i * s0 + j);
      float value = x > 0.0f ? x : c->alpha * (expf(x) - 1.0f);
      p->set_output(p->output, i * s0 * 2 + j, value);
      value = x < 0.0f ? -x : c->alpha * (expf(-x) - 1.0f);
      p->set_output(p->output, i * s0 * 2 + s0 + j, value);
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}